

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O3

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  undefined2 local_2f;
  char local_2d [2];
  char local_2b [3];
  char *local_28;
  
  if (n < 1000) {
    uVar4 = (uint)(((ulong)n & 0xffff) >> 2) / 0x19;
    uVar7 = n + uVar4 * -100;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)uVar4 | 0x30;
    bVar2 = (byte)((uVar7 & 0xff) / 10);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar2 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar7 + bVar2 * -10 | 0x30;
  }
  else {
    local_28 = local_2d;
    uVar5 = (ulong)n;
    do {
      pcVar6 = local_28;
      uVar4 = (uint)uVar5;
      uVar8 = uVar5 / 100;
      uVar1 = uVar5 / 100;
      *(undefined2 *)pcVar6 =
           *(undefined2 *)
            (::fmt::v7::detail::basic_data<void>::digits + (ulong)(uVar4 + (int)uVar1 * -100) * 2);
      local_28 = pcVar6 + -2;
      uVar5 = uVar8;
    } while (9999 < uVar4);
    if (uVar4 < 1000) {
      pcVar6[-1] = (byte)uVar8 | 0x30;
      local_28 = pcVar6 + -1;
    }
    else {
      *(undefined2 *)local_28 =
           *(undefined2 *)(::fmt::v7::detail::basic_data<void>::digits + uVar1 * 2);
    }
    ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_28,local_2b);
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000)
    {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    }
    else
    {
        append_int(n, dest);
    }
}